

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O0

MPP_RET hal_vp9d_vdpu382_init(void *hal,MppHalCfg *cfg)

{
  long lVar1;
  void *pvVar2;
  Vdpu382Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *hal_local;
  
  pvVar2 = mpp_osal_calloc("hal_vp9d_vdpu382_init",0x250);
  *(void **)((long)hal + 0x40) = pvVar2;
  if (pvVar2 == (void *)0x0) {
    p_hal._4_4_ = MPP_ERR_MALLOC;
    _mpp_log_l(2,"hal_vp9d_vdpu382","malloc buffer error(%d).\n",(char *)0x0,0xef);
    _mpp_log_l(2,"hal_vp9d_vdpu382","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
               "hal_vp9d_vdpu382_init",0xef);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  else {
    lVar1 = *(long *)((long)hal + 0x40);
    *(undefined4 *)(lVar1 + 0xf0) = 0xffffffff;
    *(undefined4 *)(lVar1 + 0xf4) = 0xffffffff;
    mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x18),SLOTS_HOR_ALIGN,vp9_hor_align);
    mpp_slots_set_prop(*(MppBufSlots *)((long)hal + 0x18),SLOTS_VER_ALIGN,vp9_ver_align);
    if ((*(long *)((long)hal + 0x28) == 0) &&
       (p_hal._4_4_ = mpp_buffer_group_get
                                ((MppBufferGroup *)((long)hal + 0x28),MPP_BUFFER_TYPE_ION,
                                 MPP_BUFFER_INTERNAL,"hal_vp9d_vdpu382","hal_vp9d_vdpu382_init"),
       p_hal._4_4_ != MPP_OK)) {
      _mpp_log_l(2,"hal_vp9d_vdpu382","vp9 mpp_buffer_group_get failed\n",(char *)0x0);
    }
    else {
      p_hal._4_4_ = hal_vp9d_alloc_res((HalVp9dCtx *)hal);
      if (p_hal._4_4_ == MPP_OK) {
        *(undefined4 *)(lVar1 + 0x15c) = 1;
        if (cfg->hal_fbc_adj_cfg == (SlotHalFbcAdjCfg *)0x0) {
          return MPP_OK;
        }
        cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 0;
        return MPP_OK;
      }
      _mpp_log_l(2,"hal_vp9d_vdpu382","hal_vp9d_alloc_res failed\n",(char *)0x0);
    }
  }
  hal_vp9d_vdpu382_deinit(hal);
  return p_hal._4_4_;
}

Assistant:

static MPP_RET hal_vp9d_vdpu382_init(void *hal, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    MEM_CHECK(ret, p_hal->hw_ctx = mpp_calloc_size(void, sizeof(Vdpu382Vp9dCtx)));
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;
    mpp_slots_set_prop(p_hal->slots, SLOTS_HOR_ALIGN, vp9_hor_align);
    mpp_slots_set_prop(p_hal->slots, SLOTS_VER_ALIGN, vp9_ver_align);

    if (p_hal->group == NULL) {
        ret = mpp_buffer_group_get_internal(&p_hal->group, MPP_BUFFER_TYPE_ION);
        if (ret) {
            mpp_err("vp9 mpp_buffer_group_get failed\n");
            goto __FAILED;
        }
    }

    ret = hal_vp9d_alloc_res(p_hal);
    if (ret) {
        mpp_err("hal_vp9d_alloc_res failed\n");
        goto __FAILED;
    }

    hw_ctx->last_segid_flag = 1;

    if (cfg->hal_fbc_adj_cfg) {
        cfg->hal_fbc_adj_cfg->func = vdpu382_afbc_align_calc;
        cfg->hal_fbc_adj_cfg->expand = 0;
    }

    return ret;
__FAILED:
    hal_vp9d_vdpu382_deinit(hal);
    return ret;
}